

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

_Bool ra_portable_deserialize(roaring_array_t *answer,char *buf,size_t maxbytes,size_t *readbytes)

{
  ushort uVar1;
  _Bool _Var2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  array_container_t *container;
  uint8_t uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int32_t cardinality;
  char *pcVar11;
  char *pcVar12;
  ushort *buf_00;
  
  *readbytes = 4;
  if (3 < maxbytes) {
    uVar9 = *(uint *)buf;
    uVar8 = uVar9 & 0xffff;
    if (uVar9 == 0x303a || uVar8 == 0x303b) {
      if (uVar8 == 0x303b) {
        uVar6 = (ulong)((uVar9 >> 0x10) + 8 >> 3);
        uVar4 = uVar6 + 4;
        *readbytes = uVar4;
        if (uVar4 <= maxbytes) {
          pcVar12 = buf + 4;
          uVar9 = (uVar9 >> 0x10) + 1;
          pcVar11 = pcVar12 + uVar6;
          goto LAB_0010a16d;
        }
      }
      else {
        *readbytes = 8;
        if (7 < maxbytes) {
          uVar9 = *(uint *)(buf + 4);
          pcVar12 = (char *)0x0;
          if (0x10000 < uVar9) goto LAB_0010a10a;
          pcVar11 = buf + 8;
          uVar4 = 8;
LAB_0010a16d:
          uVar6 = (ulong)(uVar9 * 4);
          *readbytes = uVar4 + uVar6;
          if ((uVar4 + uVar6 <= maxbytes) && (_Var2 = ra_init_with_capacity(answer,uVar9), _Var2)) {
            buf_00 = (ushort *)(pcVar11 + uVar6);
            for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
              answer->keys[uVar4] = *(uint16_t *)(pcVar11 + uVar4 * 4);
            }
            if ((uVar8 != 0x303b) || (3 < (int)uVar9)) {
              sVar5 = *readbytes;
              *readbytes = sVar5 + uVar6;
              if (maxbytes < sVar5 + uVar6) {
LAB_0010a353:
                ra_clear(answer);
                goto LAB_0010a107;
              }
              buf_00 = (ushort *)((long)buf_00 + uVar6);
            }
            for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
              uVar1 = *(ushort *)(pcVar11 + uVar4 * 4 + 2);
              cardinality = (int32_t)((ulong)uVar1 + 1);
              if (uVar8 == 0x303b) {
                sVar5 = *readbytes;
                uVar10 = 1 << ((byte)uVar4 & 7) & (uint)(byte)pcVar12[uVar4 >> 3 & 0x1fffffff];
                if ((uVar10 == 0) && (0xfff < uVar1)) {
LAB_0010a24f:
                  *readbytes = sVar5 + 0x2000;
                  if ((maxbytes < sVar5 + 0x2000) ||
                     (container = (array_container_t *)bitset_container_create(),
                     container == (array_container_t *)0x0)) goto LAB_0010a353;
                  answer->size = answer->size + 1;
                  iVar3 = bitset_container_read
                                    (cardinality,(bitset_container_t *)container,(char *)buf_00);
                  uVar7 = '\x01';
                }
                else {
                  if (uVar10 == 0) goto LAB_0010a2e0;
                  uVar6 = sVar5 + 2;
                  *readbytes = uVar6;
                  if (((maxbytes < uVar6) ||
                      (uVar6 = uVar6 + (ulong)*buf_00 * 4, *readbytes = uVar6, maxbytes < uVar6)) ||
                     (container = (array_container_t *)run_container_create(),
                     container == (array_container_t *)0x0)) goto LAB_0010a353;
                  answer->size = answer->size + 1;
                  iVar3 = run_container_read(cardinality,(run_container_t *)container,(char *)buf_00
                                            );
                  uVar7 = '\x03';
                }
              }
              else {
                sVar5 = *readbytes;
                if (0xfff < uVar1) goto LAB_0010a24f;
LAB_0010a2e0:
                uVar6 = sVar5 + ((ulong)uVar1 + 1) * 2;
                *readbytes = uVar6;
                if ((maxbytes < uVar6) ||
                   (container = array_container_create_given_capacity(cardinality),
                   container == (array_container_t *)0x0)) goto LAB_0010a353;
                answer->size = answer->size + 1;
                iVar3 = array_container_read(cardinality,container,(char *)buf_00);
                uVar7 = '\x02';
              }
              buf_00 = (ushort *)((long)buf_00 + (long)iVar3);
              answer->containers[uVar4] = container;
              answer->typecodes[uVar4] = uVar7;
            }
            pcVar12 = (char *)(ulong)((long)(int)uVar9 <= (long)uVar4);
            goto LAB_0010a10a;
          }
        }
      }
    }
  }
LAB_0010a107:
  pcVar12 = (char *)0x0;
LAB_0010a10a:
  return SUB81(pcVar12,0);
}

Assistant:

bool ra_portable_deserialize(roaring_array_t *answer, const char *buf,
                             const size_t maxbytes, size_t *readbytes) {
    *readbytes = sizeof(int32_t);  // for cookie
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading first 4 bytes.
        return false;
    }
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        // "I failed to find one of the right cookies.
        return false;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        *readbytes += sizeof(int32_t);
        if (*readbytes > maxbytes) {
            // Ran out of bytes while reading second part of the cookie.
            return false;
        }
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size < 0) {
        // You cannot have a negative number of containers, the data must be
        // corrupted.
        return false;
    }
    if (size > (1 << 16)) {
        // You cannot have so many containers, the data must be corrupted.
        return false;
    }
    const char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        *readbytes += s;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading run bitmap.
            return false;
        }
        bitmapOfRunContainers = buf;
        buf += s;
    }
    uint16_t *keyscards = (uint16_t *)buf;

    *readbytes += size * 2 * sizeof(uint16_t);
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading key-cardinality array.
        return false;
    }
    buf += size * 2 * sizeof(uint16_t);

    bool is_ok = ra_init_with_capacity(answer, size);
    if (!is_ok) {
        // Failed to allocate memory for roaring array. Bailing out.
        return false;
    }

    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k, sizeof(tmp));
        answer->keys[k] = tmp;
    }
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        *readbytes += size * 4;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading offsets.
            ra_clear(answer);  // we need to clear the containers already
                               // allocated, and the roaring array
            return false;
        }

        // skipping the offsets
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k + 1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }
        if (isbitmap) {
            // we check that the read is allowed
            size_t containersize =
                BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            bitset_container_t *c = bitset_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += bitset_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = BITSET_CONTAINER_TYPE;
        } else if (isrun) {
            // we check that the read is allowed
            *readbytes += sizeof(uint16_t);
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a run container (header).
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            size_t containersize = n_runs * sizeof(rle16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read

            run_container_t *c = run_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += run_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = RUN_CONTAINER_TYPE;
        } else {
            // we check that the read is allowed
            size_t containersize = thiscard * sizeof(uint16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            array_container_t *c =
                array_container_create_given_capacity(thiscard);
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += array_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = ARRAY_CONTAINER_TYPE;
        }
    }
    return true;
}